

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void __thiscall tcu::DebugOutStreambuf::~DebugOutStreambuf(DebugOutStreambuf *this)

{
  long lVar1;
  
  *(undefined ***)this = &PTR__DebugOutStreambuf_007884c0;
  lVar1 = std::ostream::tellp();
  if (lVar1 != 0) {
    flushLine(this);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_curLine);
  std::ios_base::~ios_base((ios_base *)&this->field_0xb0);
  *(code **)this = __cxa_guard_release;
  std::locale::~locale((locale *)&this->field_0x38);
  return;
}

Assistant:

DebugOutStreambuf::~DebugOutStreambuf (void)
{
	if (m_curLine.tellp() != std::streampos(0))
		flushLine();
}